

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_rshift_safe_into(mp_int *r,mp_int *x,size_t bits)

{
  mp_copy_into(r,x);
  mp_rshift_safe_in_place(r,bits);
  return;
}

Assistant:

void mp_rshift_safe_into(mp_int *r, mp_int *x, size_t bits)
{
    mp_copy_into(r, x);
    mp_rshift_safe_in_place(r, bits);
}